

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  EVP_PKEY *pkey;
  char *__name;
  quicly_context_t *stream_00;
  quicly_stream_t *stream;
  quicly_conn_t *client;
  quicly_stream_open_t stream_open;
  ptls_openssl_sign_certificate_t sign_certificate;
  sockaddr_storage sa;
  ptls_context_t tlsctx;
  quicly_stream_t *local_1e8;
  quicly_stream_t *local_1e0;
  undefined1 local_1d8 [112];
  sockaddr local_168 [8];
  ptls_context_t local_e8;
  
  memcpy(&local_e8,&PTR_ptls_openssl_random_bytes_0013b590,0xb8);
  local_1d8._56_8_ = on_stream_open;
  memcpy(&ctx,&quicly_spec_context,0x100);
  ctx.tls = &local_e8;
  quicly_amend_ptls_context(&local_e8);
  local_1e8 = (quicly_stream_t *)0x12e1ba;
  ctx.stream_open = (quicly_stream_open_t *)(local_1d8 + 0x38);
  while( true ) {
    while (stream_00 = (quicly_context_t *)argv, iVar1 = getopt(argc,argv,"c:k:p:h"), 0x67 < iVar1)
    {
      if (iVar1 == 0x6b) {
        stream_00 = (quicly_context_t *)0x12d451;
        pFVar3 = fopen((char *)_optarg,"r");
        if (pFVar3 == (FILE *)0x0) goto LAB_0011a144;
        stream_00 = (quicly_context_t *)0x0;
        pkey = PEM_read_PrivateKey(pFVar3,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        fclose(pFVar3);
        if (pkey == (EVP_PKEY *)0x0) goto LAB_0011a149;
        ptls_openssl_init_sign_certificate
                  ((ptls_openssl_sign_certificate_t *)(local_1d8 + 0x58),(EVP_PKEY *)pkey);
        EVP_PKEY_free(pkey);
        local_e8.sign_certificate = (ptls_sign_certificate_t *)(local_1d8 + 0x58);
      }
      else {
        if (iVar1 != 0x70) {
          if (iVar1 == 0x68) {
            printf("Usage: %s [options] [host]\nOptions:\n  -c <file>    specifies the certificate chain file (PEM format)\n  -k <file>    specifies the private key file (PEM format)\n  -p <number>  specifies the port number (default: 4433)\n  -h           prints this help\n\nWhen both `-c` and `-k` is specified, runs as a server.  Otherwise, runs as a\nclient connecting to host:port.  If omitted, host defaults to 127.0.0.1.\n"
                   ,*argv);
            exit(0);
          }
          goto LAB_0011a133;
        }
        local_1e8 = _optarg;
      }
    }
    if (iVar1 != 99) break;
    stream_00 = (quicly_context_t *)_optarg;
    iVar1 = ptls_load_certificates(&local_e8,(char *)_optarg);
    if (iVar1 != 0) {
      main_cold_3();
LAB_0011a144:
      main_cold_2();
LAB_0011a149:
      main_cold_1();
LAB_0011a14e:
      main_cold_4();
LAB_0011a153:
      main_cold_8();
LAB_0011a158:
      main_cold_6();
LAB_0011a15d:
      main_cold_7();
      iVar1 = quicly_streambuf_create((quicly_stream_t *)stream_00,0x48);
      if (iVar1 == 0) {
        ((quicly_stream_t *)stream_00)->callbacks = &on_stream_open::stream_callbacks;
        iVar1 = 0;
      }
      return iVar1;
    }
  }
  if (iVar1 != -1) {
LAB_0011a133:
    exit(1);
  }
  if (((ptls_openssl_sign_certificate_t *)local_e8.sign_certificate ==
      (ptls_openssl_sign_certificate_t *)0x0) ==
      ((st_quicly_linklist_t *)local_e8.certificates.count != (st_quicly_linklist_t *)0x0))
  goto LAB_0011a14e;
  if (_optind == argc) {
    __name = "127.0.0.1";
  }
  else {
    __name = argv[_optind];
  }
  local_1d8._16_8_ = (quicly_stream_callbacks_t *)0x0;
  local_1d8._24_8_ = (sockaddr *)0x0;
  local_1d8._32_8_ = (char *)0x0;
  local_1d8._40_8_ = (addrinfo *)0x0;
  local_1d8._0_8_ = (quicly_conn_t *)0x200000421;
  local_1d8._8_8_ = 2;
  iVar1 = getaddrinfo(__name,(char *)local_1e8,(addrinfo *)local_1d8,(addrinfo **)&local_1e0);
  pFVar3 = _stderr;
  if (local_1e0 == (quicly_stream_t *)0x0 || iVar1 != 0) {
    if (iVar1 != 0) {
      gai_strerror(iVar1);
    }
    fprintf(pFVar3,"failed to resolve address:%s:%s:%s\n",__name,local_1e8);
  }
  else {
    memcpy(local_168,(sockaddr *)(local_1e0->sendstate).acked.ranges,
           (ulong)*(uint *)&local_1e0->callbacks);
    pFVar3 = (FILE *)(ulong)*(uint *)&local_1e0->callbacks;
    freeaddrinfo((addrinfo *)local_1e0);
  }
  if (local_1e0 == (quicly_stream_t *)0x0 || iVar1 != 0) goto LAB_0011a133;
  stream_00 = (quicly_context_t *)0x2;
  iVar1 = socket((uint)local_168[0].sa_family,2,0);
  if (iVar1 == -1) goto LAB_0011a153;
  if (((ctx.tls)->certificates).count == 0) {
LAB_0011a035:
    stream_00 = (quicly_context_t *)local_1d8;
    local_1d8._0_8_ = (quicly_conn_t *)0x0;
    local_1d8._8_8_ = 0;
    iVar2 = bind(iVar1,(sockaddr *)stream_00,0x10);
    if (iVar2 != 0) goto LAB_0011a158;
  }
  else {
    local_1d8._0_4_ = 1;
    setsockopt(iVar1,1,2,local_1d8,4);
    iVar2 = bind(iVar1,local_168,(socklen_t)pFVar3);
    if (iVar2 != 0) {
      main_cold_5();
      goto LAB_0011a035;
    }
  }
  local_1d8._0_8_ = (quicly_conn_t *)0x0;
  if (((ctx.tls)->certificates).count == 0) {
    local_1d8._64_8_ = (quicly_range_t *)0x0;
    local_1d8._72_8_ = 0;
    stream_00 = &ctx;
    iVar2 = quicly_connect((quicly_conn_t **)local_1d8,&ctx,__name,(sockaddr *)local_168,
                           (sockaddr *)0x0,&next_cid,(ptls_iovec_t)ZEXT816(0),
                           (ptls_handshake_properties_t *)0x0,(quicly_transport_parameters_t *)0x0);
    if (iVar2 != 0) goto LAB_0011a15d;
    quicly_open_stream((quicly_conn_t *)local_1d8._0_8_,&local_1e0,0);
  }
  iVar1 = run_loop(iVar1,(quicly_conn_t *)local_1d8._0_8_);
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t sign_certificate;
    ptls_context_t tlsctx = {
        .random_bytes = ptls_openssl_random_bytes,
        .get_time = &ptls_get_time,
        .key_exchanges = ptls_openssl_key_exchanges,
        .cipher_suites = ptls_openssl_cipher_suites,
    };
    quicly_stream_open_t stream_open = {on_stream_open};
    char *host = "127.0.0.1", *port = "4433";
    struct sockaddr_storage sa;
    socklen_t salen;
    int ch, fd;

    /* setup quic context */
    ctx = quicly_spec_context;
    ctx.tls = &tlsctx;
    quicly_amend_ptls_context(ctx.tls);
    ctx.stream_open = &stream_open;

    /* resolve command line options and arguments */
    while ((ch = getopt(argc, argv, "c:k:p:h")) != -1) {
        switch (ch) {
        case 'c': /* load certificate chain */ {
            int ret;
            if ((ret = ptls_load_certificates(&tlsctx, optarg)) != 0) {
                fprintf(stderr, "failed to load certificates from file %s:%d\n", optarg, ret);
                exit(1);
            }
        } break;
        case 'k': /* load private key */ {
            FILE *fp;
            if ((fp = fopen(optarg, "r")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            EVP_PKEY *pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                exit(1);
            }
            ptls_openssl_init_sign_certificate(&sign_certificate, pkey);
            EVP_PKEY_free(pkey);
            tlsctx.sign_certificate = &sign_certificate.super;
        } break;
        case 'p': /* port */
            port = optarg;
            break;
        case 'h': /* help */
            usage(argv[0]);
            break;
        default:
            exit(1);
            break;
        }
    }
    if ((tlsctx.certificates.count != 0) != (tlsctx.sign_certificate != NULL)) {
        fprintf(stderr, "-c and -k options must be used together\n");
        exit(1);
    }
    argc -= optind;
    argv += optind;
    if (argc != 0)
        host = *argv++;
    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, AF_INET, SOCK_DGRAM, 0) != 0)
        exit(1);

    /* open socket, on the specified port (as a server), or on any port (as a client) */
    if ((fd = socket(sa.ss_family, SOCK_DGRAM, 0)) == -1) {
        perror("socket(2) failed");
        exit(1);
    }
    // fcntl(fd, F_SETFL, O_NONBLOCK);
    if (is_server()) {
        int reuseaddr = 1;
        setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &reuseaddr, sizeof(reuseaddr));
        if (bind(fd, (struct sockaddr *)&sa, salen) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    } else {
        struct sockaddr_in local;
        memset(&local, 0, sizeof(local));
        if (bind(fd, (struct sockaddr *)&local, sizeof(local)) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    }

    quicly_conn_t *client = NULL;
    if (!is_server()) {
        /* initiate a connection, and open a stream */
        int ret;
        if ((ret = quicly_connect(&client, &ctx, host, (struct sockaddr *)&sa, NULL, &next_cid, ptls_iovec_init(NULL, 0), NULL,
                                  NULL)) != 0) {
            fprintf(stderr, "quicly_connect failed:%d\n", ret);
            exit(1);
        }
        quicly_stream_t *stream; /* we retain the opened stream via the on_stream_open callback */
        quicly_open_stream(client, &stream, 0);
    }

    /* enter the event loop with a connection object */
    return run_loop(fd, client);
}